

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O1

char * __thiscall QGenericItemModel::index(QGenericItemModel *this,char *__s,int __c)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  undefined1 local_30 [4];
  int local_2c [3];
  undefined1 *puStack_20;
  int *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = local_2c;
  puStack_20 = local_30;
  puVar1 = *(undefined8 **)(__s + 0x10);
  *(undefined4 *)this = 0xaaaaaaaa;
  *(undefined4 *)(this + 4) = 0xaaaaaaaa;
  *(undefined4 *)(this + 8) = 0xaaaaaaaa;
  *(undefined4 *)(this + 0xc) = 0xaaaaaaaa;
  *(undefined1 **)(this + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  local_2c[0] = __c;
  (*(code *)*puVar1)(0,puVar1,this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (char *)this;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QGenericItemModel::index(int row, int column, const QModelIndex &parent) const
{
    return impl->callConst<QModelIndex>(QGenericItemModelImplBase::Index, row, column, parent);
}